

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# camera.cc
# Opt level: O0

PinholeCamera * __thiscall gmath::PinholeCamera::operator=(PinholeCamera *this,PinholeCamera *pc)

{
  int iVar1;
  undefined4 extraout_var;
  PinholeCamera *in_RSI;
  PinholeCamera *in_RDI;
  Camera *in_stack_ffffffffffffffd8;
  Camera *in_stack_ffffffffffffffe0;
  
  if (in_RDI != in_RSI) {
    Camera::operator=(in_stack_ffffffffffffffe0,in_stack_ffffffffffffffd8);
    SMatrix<double,_3,_3>::operator=(&in_RDI->A,&in_RSI->A);
    in_RDI->rho = in_RSI->rho;
    if (in_RDI->dist != (Distortion *)0x0) {
      (*in_RDI->dist->_vptr_Distortion[1])();
    }
    in_RDI->dist = (Distortion *)0x0;
    if (in_RSI->dist != (Distortion *)0x0) {
      iVar1 = (*in_RSI->dist->_vptr_Distortion[2])();
      in_RDI->dist = (Distortion *)CONCAT44(extraout_var,iVar1);
    }
  }
  return in_RDI;
}

Assistant:

PinholeCamera &PinholeCamera::operator = (const PinholeCamera &pc)
{
  if (this != &pc)
  {
    Camera::operator=(pc);

    A=pc.A;
    rho=pc.rho;

    delete dist;
    dist=0;

    if (pc.dist != 0)
    {
      dist=pc.dist->clone();
    }
  }

  return *this;
}